

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_seqDecompressedSize(seqDef *sequences,size_t nbSeq,size_t litSize)

{
  long local_40;
  size_t matchLengthSum;
  seqDef *sp;
  seqDef *send;
  seqDef *sstart;
  size_t litSize_local;
  size_t nbSeq_local;
  seqDef *sequences_local;
  
  local_40 = 0;
  for (matchLengthSum = (size_t)sequences;
      0 < (long)((long)sequences + (nbSeq * 8 - matchLengthSum)) >> 3;
      matchLengthSum = matchLengthSum + 8) {
    local_40 = (int)(*(ushort *)(matchLengthSum + 6) + 3) + local_40;
  }
  return local_40 + litSize;
}

Assistant:

static size_t ZSTD_seqDecompressedSize(const seqDef* sequences, size_t nbSeq, size_t litSize) {
    const seqDef* const sstart = sequences;
    const seqDef* const send = sequences + nbSeq;
    const seqDef* sp = sstart;
    size_t matchLengthSum = 0;
    while (send-sp > 0) {
      matchLengthSum += sp->matchLength + MINMATCH;
      sp++;
    }
    return matchLengthSum + litSize;
}